

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O2

int AF_A_ExtChase(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  bool bVar2;
  FState *meleestate;
  AActor *actor;
  char *pcVar3;
  FState *missilestate;
  bool nightmarefast;
  
  if (numparam < 1) {
    pcVar3 = "(paramnum) < numparam";
    goto LAB_00498693;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_00498683:
    pcVar3 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_00498693:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                  ,0xaf9,"int AF_A_ExtChase(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  actor = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (actor == (AActor *)0x0) goto LAB_0049859e;
    stack = (VMFrameStack *)actor;
    bVar2 = DObject::IsKindOf((DObject *)actor,AActor::RegistrationInfo.MyClass);
    if (!bVar2) {
      pcVar3 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_00498693;
    }
  }
  else {
    if (actor != (AActor *)0x0) goto LAB_00498683;
LAB_0049859e:
    actor = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar3 = "(paramnum) < numparam";
LAB_004986bb:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                  ,0xafa,"int AF_A_ExtChase(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  if (param[1].field_0.field_3.Type != '\0') {
    pcVar3 = "param[paramnum].Type == REGT_INT";
    goto LAB_004986bb;
  }
  if ((uint)numparam < 3) {
    pcVar3 = "(paramnum) < numparam";
LAB_004986e3:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                  ,0xafb,"int AF_A_ExtChase(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  if (param[2].field_0.field_3.Type != '\0') {
    pcVar3 = "param[paramnum].Type == REGT_INT";
    goto LAB_004986e3;
  }
  if (numparam == 3) {
    bVar2 = true;
  }
  else {
    VVar1 = param[3].field_0.field_3.Type;
    if (VVar1 == '\0') {
      bVar2 = param[3].field_0.i != 0;
    }
    else {
      bVar2 = true;
      if (VVar1 != 0xff) {
        __assert_fail("param[paramnum].Type == REGT_INT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                      ,0xafc,"int AF_A_ExtChase(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
    }
    if (4 < (uint)numparam) {
      VVar1 = param[4].field_0.field_3.Type;
      if (VVar1 == '\0') {
        nightmarefast = param[4].field_0.i != 0;
        goto LAB_0049862f;
      }
      if (VVar1 != 0xff) {
        __assert_fail("param[paramnum].Type == REGT_INT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                      ,0xafd,"int AF_A_ExtChase(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
    }
  }
  nightmarefast = false;
LAB_0049862f:
  if (param[1].field_0.i == 0) {
    meleestate = (FState *)0x0;
  }
  else {
    meleestate = actor->MeleeState;
  }
  if (param[2].field_0.i == 0) {
    missilestate = (FState *)0x0;
  }
  else {
    missilestate = actor->MissileState;
  }
  A_DoChase(stack,actor,false,meleestate,missilestate,bVar2,nightmarefast,false,0);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_ExtChase)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_BOOL		(domelee);
	PARAM_BOOL		(domissile);
	PARAM_BOOL_OPT	(playactive)	{ playactive = true; }
	PARAM_BOOL_OPT	(nightmarefast)	{ nightmarefast = false; }

	// Now that A_Chase can handle state label parameters, this function has become rather useless...
	A_DoChase(stack, self, false,
		domelee ? self->MeleeState : NULL, domissile ? self->MissileState : NULL,
		playactive, nightmarefast, false, 0);
	return 0;
}